

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

size_t mpack_expect_str_buf(mpack_reader_t *reader,char *buf,size_t bufsize)

{
  uint32_t uVar1;
  ulong count;
  
  uVar1 = mpack_expect_str(reader);
  if (reader->error == mpack_ok) {
    count = (ulong)uVar1;
    if (count <= bufsize) {
      mpack_read_native(reader,buf,count);
      if (reader->error != mpack_ok) {
        return 0;
      }
      return count;
    }
    mpack_reader_flag_error(reader,mpack_error_too_big);
  }
  return 0;
}

Assistant:

size_t mpack_expect_str_buf(mpack_reader_t* reader, char* buf, size_t bufsize) {
    mpack_assert(buf != NULL, "buf cannot be NULL");

    size_t length = mpack_expect_str(reader);
    if (mpack_reader_error(reader))
        return 0;

    if (length > bufsize) {
        mpack_reader_flag_error(reader, mpack_error_too_big);
        return 0;
    }

    mpack_read_bytes(reader, buf, length);
    if (mpack_reader_error(reader))
        return 0;

    mpack_done_str(reader);
    return length;
}